

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

void isobusfs_dump_tx_data(isobusfs_buf_log *buffer)

{
  isobusfs_buf_log *piVar1;
  char *__s;
  long lVar2;
  ulong uVar3;
  char data_str [24];
  
  piVar1 = buffer;
  for (uVar3 = 0; __s = data_str, uVar3 != 10; uVar3 = uVar3 + 1) {
    data_str[0x10] = '\0';
    data_str[0x11] = '\0';
    data_str[0x12] = '\0';
    data_str[0x13] = '\0';
    data_str[0x14] = '\0';
    data_str[0x15] = '\0';
    data_str[0x16] = '\0';
    data_str[0x17] = '\0';
    data_str[0] = '\0';
    data_str[1] = '\0';
    data_str[2] = '\0';
    data_str[3] = '\0';
    data_str[4] = '\0';
    data_str[5] = '\0';
    data_str[6] = '\0';
    data_str[7] = '\0';
    data_str[8] = '\0';
    data_str[9] = '\0';
    data_str[10] = '\0';
    data_str[0xb] = '\0';
    data_str[0xc] = '\0';
    data_str[0xd] = '\0';
    data_str[0xe] = '\0';
    data_str[0xf] = '\0';
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      snprintf(__s,4,"%02X ",(ulong)piVar1->entries[0].data[lVar2]);
      __s = __s + 3;
    }
    isobusfs_log(LOG_LEVEL_DEBUG,"Entry %u: %s Timestamp: %ld.%09ld\n",uVar3 & 0xffffffff,data_str,
                 buffer->entries[uVar3].ts.tv_sec,buffer->entries[uVar3].ts.tv_nsec);
    piVar1 = (isobusfs_buf_log *)(piVar1->entries + 1);
  }
  return;
}

Assistant:

void isobusfs_dump_tx_data(const struct isobusfs_buf_log *buffer)
{
	uint i;

	for (i = 0; i < ISOBUSFS_MAX_BUF_ENTRIES; ++i) {
		const struct isobusfs_buf *entry = &buffer->entries[i];
		char data_str[ISOBUSFS_MIN_TRANSFER_LENGH * 3] = {0};
		uint j;

		for (j = 0; j < ISOBUSFS_MIN_TRANSFER_LENGH; ++j)
			snprintf(data_str + j * 3, 4, "%02X ", entry->data[j]);

		pr_debug("Entry %u: %s Timestamp: %ld.%09ld\n", i, data_str,
			 entry->ts.tv_sec, entry->ts.tv_nsec);
	}
}